

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_size(void)

{
  initializer_list<int> input;
  undefined4 local_8c;
  size_type local_88;
  undefined4 local_7c;
  size_type local_78 [2];
  int local_68 [4];
  iterator local_58;
  undefined8 local_50;
  undefined4 local_44;
  size_type local_40 [2];
  undefined1 local_30 [8];
  circular_view<int,_4UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_4UL>::circular_view<4UL,_0>
            ((circular_view<int,_4UL> *)local_30,(value_type (*) [4])&span.member.next);
  local_40[0] = vista::circular_view<int,_4UL>::size((circular_view<int,_4UL> *)local_30);
  local_44 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x351,"void api_fixed_suite::fixed_size()",local_40,&local_44);
  local_68[0] = 0xb;
  local_68[1] = 0x16;
  local_68[2] = 0x21;
  local_68[3] = 0x2c;
  local_58 = local_68;
  local_50 = 4;
  input._M_len = 4;
  input._M_array = local_58;
  vista::circular_view<int,_4UL>::operator=((circular_view<int,_4UL> *)local_30,input);
  local_78[0] = vista::circular_view<int,_4UL>::size((circular_view<int,_4UL> *)local_30);
  local_7c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x353,"void api_fixed_suite::fixed_size()",local_78,&local_7c);
  vista::circular_view<int,_4UL>::push_back((circular_view<int,_4UL> *)local_30,0x37);
  local_88 = vista::circular_view<int,_4UL>::size((circular_view<int,_4UL> *)local_30);
  local_8c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x355,"void api_fixed_suite::fixed_size()",&local_88,&local_8c);
  return;
}

Assistant:

void fixed_size()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span.size(), 4);
    span.push_back(55);
    BOOST_TEST_EQ(span.size(), 4);
}